

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VelocityZ.cpp
# Opt level: O3

void __thiscall OpenMD::VelocityZ::process(VelocityZ *this)

{
  long *plVar1;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *this_00;
  char cVar2;
  uint uVar3;
  SimInfo *info;
  Snapshot *this_01;
  pointer pvVar4;
  iterator __position;
  iterator __position_00;
  pointer pvVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  SelectionManager *this_02;
  int iVar10;
  uint i_1;
  double *__args;
  SelectionSet *pSVar11;
  uint i;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int ii;
  Vector3d pos;
  StuntDouble *sd;
  Mat3x3d hmat;
  DumpReader reader;
  int local_1324;
  pointer local_1320;
  SelectionSet local_1318;
  double local_1300;
  StuntDouble *local_12f8;
  int local_12ec;
  vector<double,std::allocator<double>> *local_12e8;
  SelectionEvaluator *local_12e0;
  SelectionManager *local_12d8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar10 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar10 / (this->super_StaticAnalyser).step_;
  if (0 < iVar10) {
    local_12e8 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_12e0 = &this->evaluator_;
    local_12d8 = &this->seleMan_;
    uVar19 = 0;
    local_12ec = iVar10;
    do {
      this_02 = local_12d8;
      DumpReader::readFrame(&local_1288,(int)uVar19);
      this_01 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      this->currentSnapshot_ = this_01;
      uVar18 = this->nBins2_;
      if ((ulong)uVar18 != 0) {
        uVar3 = (this->super_StaticAnalyser).nBins_;
        pvVar4 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = 0;
        do {
          if (uVar3 != 0) {
            lVar21 = *(long *)&pvVar4[uVar13].
                               super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            lVar14 = 0;
            do {
              if (*(long *)(lVar21 + 8 + lVar14) != *(long *)(lVar21 + lVar14)) {
                *(long *)(lVar21 + 8 + lVar14) = *(long *)(lVar21 + lVar14);
              }
              lVar14 = lVar14 + 0x18;
            } while ((ulong)uVar3 * 0x18 != lVar14);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar18);
      }
      Snapshot::getHmat(&local_12d0,this_01);
      __args = (double *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis2_ * 0x20);
      __position._M_current =
           (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_12e8,__position,__args);
        local_1320 = *(pointer *)
                      ((long)local_12d0.super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_ +
                      (ulong)(uint)this->axis2_ * 0x20);
      }
      else {
        local_1320 = (pointer)*__args;
        *__position._M_current = (double)local_1320;
        (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_1300 = *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)(uint)this->axis1_ * 0x20) * 0.5;
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1318,local_12e0);
        lVar21 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar21),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&((local_1318.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar21));
          lVar21 = lVar21 + 0x28;
        } while (lVar21 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1318.bitsets_);
      }
      local_12f8 = SelectionManager::beginSelected(this_02,&local_1324);
      local_1320 = (pointer)((double)local_1320 * 0.5);
      while (local_12f8 != (StuntDouble *)0x0) {
        pSVar11 = (SelectionSet *)
                  ((long)local_12f8->localIndex_ * 0x18 +
                  *(long *)((long)&(local_12f8->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_12f8->storage_)
                  );
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pSVar11 != &local_1318) {
          lVar21 = 0;
          do {
            (&local_1318.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar21] =
                 (&(pSVar11->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
        }
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
        }
        pSVar11 = (SelectionSet *)
                  ((long)local_12f8->localIndex_ * 0x18 +
                  *(long *)((long)&(local_12f8->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_12f8->storage_)
                  );
        if (pSVar11 != &local_1318) {
          lVar21 = 0;
          do {
            (&(pSVar11->bitsets_).
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar21] =
                 (&local_1318.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
        }
        local_12f8 = SelectionManager::nextSelected(this_02,&local_1324);
      }
      local_12f8 = SelectionManager::beginSelected(this_02,&local_1324);
      while( true ) {
        if (local_12f8 == (StuntDouble *)0x0) break;
        lVar21 = *(long *)((long)&(local_12f8->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_12f8->storage_);
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(lVar21 + 0x10 + (long)local_12f8->localIndex_ * 0x18);
        plVar1 = (long *)(lVar21 + (long)local_12f8->localIndex_ * 0x18);
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar1;
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar1[1];
        this_00 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                  (*(long *)&(this->sliceSDLists_).
                             super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [(int)((((double)(&local_1318.bitsets_.
                                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                                ._M_impl.super__Vector_impl_data._M_start)
                                              [(uint)this->axis2_] + (double)local_1320) *
                                    (double)this->nBins2_) /
                                   *(double *)
                                    ((long)local_12d0.super_SquareMatrix<double,_3>.
                                           super_RectMatrix<double,_3U,_3U>.data_ +
                                    (ulong)(uint)this->axis2_ * 0x20))].
                             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                             ._M_impl.super__Vector_impl_data +
                  (long)(int)((((double)(&local_1318.bitsets_.
                                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                          ._M_impl.super__Vector_impl_data._M_start)
                                        [(uint)this->axis1_] + local_1300) *
                              (double)(this->super_StaticAnalyser).nBins_) /
                             *(double *)
                              ((long)local_12d0.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ +
                              (ulong)(uint)this->axis1_ * 0x20)) * 0x18);
        __position_00._M_current = *(StuntDouble ***)(this_00 + 8);
        if (__position_00._M_current == *(StuntDouble ***)(this_00 + 0x10)) {
          std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
          _M_realloc_insert<OpenMD::StuntDouble*const&>(this_00,__position_00,&local_12f8);
        }
        else {
          *__position_00._M_current = local_12f8;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        local_12f8 = SelectionManager::nextSelected(this_02,&local_1324);
      }
      local_1300 = (double)uVar19;
      uVar18 = this->nBins2_;
      if ((ulong)uVar18 != 0) {
        uVar13 = (ulong)(this->super_StaticAnalyser).nBins_;
        local_1320 = (this->sliceSDLists_).
                     super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = 0;
        do {
          if (uVar13 != 0) {
            lVar21 = *(long *)&local_1320[uVar12].
                               super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            uVar3 = this->axis3_;
            pvVar5 = (this->velocity_).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar15 = 0;
            do {
              lVar14 = *(long *)(lVar21 + uVar15 * 0x18);
              lVar6 = *(long *)(lVar21 + 8 + uVar15 * 0x18);
              lVar16 = lVar6 - lVar14;
              if (lVar16 != 0) {
                uVar17 = lVar16 >> 3;
                dVar9 = 0.0;
                uVar20 = 0;
                uVar22 = 1;
                do {
                  lVar16 = *(long *)(lVar14 + uVar20 * 8);
                  lVar7 = *(long *)(*(long *)(*(long *)(lVar16 + 0x18) + 0x18) + 0x18 +
                                   *(long *)(lVar16 + 0x10));
                  local_1318.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       *(pointer *)(lVar7 + 0x10 + (long)*(int *)(lVar16 + 0x30) * 0x18);
                  plVar1 = (long *)(lVar7 + (long)*(int *)(lVar16 + 0x30) * 0x18);
                  local_1318.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                  local_1318.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar1[1];
                  dVar9 = dVar9 + (double)(&local_1318.bitsets_.
                                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                            ._M_impl.super__Vector_impl_data._M_start)[uVar3];
                  bVar8 = uVar22 < uVar17;
                  uVar20 = uVar22;
                  uVar22 = (ulong)((int)uVar22 + 1);
                } while (bVar8);
                if (lVar6 != lVar14) {
                  lVar14 = *(long *)&pvVar5[uVar12].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  *(double *)(lVar14 + uVar15 * 8) =
                       dVar9 / (double)(long)uVar17 + *(double *)(lVar14 + uVar15 * 8);
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar13);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar18);
      }
      uVar18 = (int)uVar19 + (this->super_StaticAnalyser).step_;
      uVar19 = (ulong)uVar18;
    } while ((int)uVar18 < local_12ec);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void VelocityZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          sliceSDLists_[i][j].clear();
        }
      }

      Mat3x3d hmat = currentSnapshot_->getHmat();

      zBox_.push_back(hmat(axis2_, axis2_));

      RealType halfBox1_ = hmat(axis1_, axis1_) / 2.0;
      RealType halfBox2_ = hmat(axis2_, axis2_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo1 =
            int(nBins_ * (halfBox1_ + pos[axis1_]) / hmat(axis1_, axis1_));
        int binNo2 =
            int(nBins2_ * (halfBox2_ + pos[axis2_]) / hmat(axis2_, axis2_));
        sliceSDLists_[binNo2][binNo1].push_back(sd);
      }

      // loop over the slices to calculate the velocities
      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          RealType totalVelocity = 0;
          for (unsigned int k = 0; k < sliceSDLists_[i][j].size(); ++k) {
            totalVelocity += sliceSDLists_[i][j][k]->getVel()[axis3_];
          }

          if (sliceSDLists_[i][j].size() > 0)
            velocity_[i][j] += totalVelocity / sliceSDLists_[i][j].size();
        }
      }
    }

    writeVelocity();
  }